

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgtbp(fitsfile *fptr,char *name,char *value,int *status)

{
  byte bVar1;
  FITSfile *pFVar2;
  int iVar3;
  char *pcVar4;
  tcolumn *ptVar5;
  int tstatus;
  long width;
  long nfield;
  int datacode;
  int decimals;
  char *loc;
  int local_ac;
  double local_a8;
  long local_a0;
  int local_94;
  long local_90;
  char *local_88 [12];
  
  if (0 < *status) {
    return *status;
  }
  local_ac = 0;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pcVar4 = name + 1;
  bVar1 = name[1];
  if (0x4d < bVar1) {
    if (bVar1 < 0x54) {
      if (bVar1 == 0x4e) {
        iVar3 = strncmp(pcVar4,"NULL",4);
        if ((((iVar3 != 0) || (iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), 0 < iVar3)) ||
            (local_a0 < 1)) || (pFVar2 = fptr->Fptr, pFVar2->tfield < local_a0))
        goto switchD_0014b213_caseD_43;
        ptVar5 = pFVar2->tableptr;
        if (pFVar2->hdutype == 1) {
          iVar3 = ffc2s(value,(char *)local_88,&local_ac);
          if (iVar3 < 1) {
            strncpy(ptVar5[local_a0 + -1].strnull,(char *)local_88,0x11);
            ptVar5[local_a0 + -1].strnull[0x11] = '\0';
          }
          goto switchD_0014b213_caseD_43;
        }
        iVar3 = ffc2jj(value,(LONGLONG *)&local_a8,&local_ac);
        if (iVar3 < 1) {
          ptVar5[local_a0 + -1].tnull = (LONGLONG)local_a8;
          goto switchD_0014b213_caseD_43;
        }
        goto LAB_0014b454;
      }
      if (((bVar1 != 0x53) || (iVar3 = strncmp(pcVar4,"SCAL",4), iVar3 != 0)) ||
         ((iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), 0 < iVar3 ||
          ((local_a0 < 1 || (fptr->Fptr->tfield < local_a0)))))) goto switchD_0014b213_caseD_43;
      ptVar5 = fptr->Fptr->tableptr;
      iVar3 = ffc2dd(value,&local_a8,&local_ac);
      if (iVar3 < 1) {
        ptVar5[local_a0 + -1].tscale = local_a8;
        goto switchD_0014b213_caseD_43;
      }
    }
    else {
      if (bVar1 != 0x5a) {
        if ((((bVar1 == 0x54) && (iVar3 = strncmp(pcVar4,"TYPE",4), iVar3 == 0)) &&
            (iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), iVar3 < 1)) &&
           ((0 < local_a0 && (local_a0 <= fptr->Fptr->tfield)))) {
          ptVar5 = fptr->Fptr->tableptr;
          iVar3 = ffc2s(value,(char *)local_88,&local_ac);
          if (iVar3 < 1) {
            strcpy(ptVar5[local_a0 + -1].ttype,(char *)local_88);
          }
        }
        goto switchD_0014b213_caseD_43;
      }
      iVar3 = strncmp(pcVar4,"ZERO",4);
      if (((iVar3 != 0) || (iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), 0 < iVar3)) ||
         ((local_a0 < 1 || (fptr->Fptr->tfield < local_a0)))) goto switchD_0014b213_caseD_43;
      ptVar5 = fptr->Fptr->tableptr;
      iVar3 = ffc2dd(value,&local_a8,&local_ac);
      if (iVar3 < 1) {
        ptVar5[local_a0 + -1].tzero = local_a8;
        goto switchD_0014b213_caseD_43;
      }
    }
    pcVar4 = "Error reading value of %s as a double: %s";
    goto LAB_0014b734;
  }
  switch(bVar1) {
  case 0x42:
    iVar3 = strncmp(pcVar4,"BCOL",4);
    if (((iVar3 != 0) || (iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), 0 < iVar3)) ||
       ((local_a0 < 1 ||
        ((pFVar2 = fptr->Fptr, pFVar2->tfield < local_a0 || (pFVar2->hdutype == 2))))))
    goto switchD_0014b213_caseD_43;
    ptVar5 = pFVar2->tableptr;
    iVar3 = ffc2ii(value,(long *)&local_a8,status);
    if (iVar3 < 1) {
      ptVar5[local_a0 + -1].tbcol = (long)local_a8 + -1;
      goto switchD_0014b213_caseD_43;
    }
    break;
  default:
    goto switchD_0014b213_caseD_43;
  case 0x44:
    if (((name[2] != 'I') || (name[3] != 'M')) ||
       ((fptr->Fptr->hdutype == 1 ||
        (((iVar3 = ffc2ii(name + 4,&local_a0,&local_ac), 0 < iVar3 || (local_a0 < 1)) ||
         (fptr->Fptr->tfield < local_a0)))))) goto switchD_0014b213_caseD_43;
    ptVar5 = fptr->Fptr->tableptr;
    iVar3 = ptVar5[local_a0 + -1].tdatatype;
    if (((iVar3 != 0x10) && (iVar3 != -9999)) ||
       (local_88[0] = strchr(value,0x28), local_88[0] == (char *)0x0))
    goto switchD_0014b213_caseD_43;
    ptVar5 = ptVar5 + local_a0;
    local_88[0] = local_88[0] + 1;
    local_a8 = (double)strtol(local_88[0],local_88,10);
    if (ptVar5[-1].trepeat != 1 && ptVar5[-1].trepeat < (long)local_a8)
    goto switchD_0014b213_caseD_43;
    goto LAB_0014b81a;
  case 0x46:
    iVar3 = strncmp(pcVar4,"FORM",4);
    if ((((iVar3 != 0) || (iVar3 = ffc2ii(name + 5,&local_a0,&local_ac), 0 < iVar3)) ||
        (local_a0 < 1)) || (fptr->Fptr->tfield < local_a0)) goto switchD_0014b213_caseD_43;
    ptVar5 = fptr->Fptr->tableptr + local_a0;
    iVar3 = ffc2s(value,(char *)local_88,&local_ac);
    if (0 < iVar3) goto switchD_0014b213_caseD_43;
    strncpy(ptVar5[-1].tform,(char *)local_88,9);
    ptVar5[-1].tform[9] = '\0';
    if (fptr->Fptr->hdutype == 1) {
      iVar3 = ffasfm((char *)local_88,&local_94,(long *)&local_a8,(int *)&local_90,status);
      if (0 < iVar3) goto switchD_0014b213_caseD_43;
      ptVar5[-1].tdatatype = 0x10;
      ptVar5[-1].trepeat = 1;
    }
    else {
      iVar3 = ffbnfm((char *)local_88,&local_94,&local_90,(long *)&local_a8,status);
      if (0 < iVar3) goto switchD_0014b213_caseD_43;
      ptVar5[-1].tdatatype = local_94;
      ptVar5[-1].trepeat = local_90;
      if ((local_94 == 0x10) && (ptVar5[-1].twidth <= local_90 && ptVar5[-1].twidth != 0))
      goto switchD_0014b213_caseD_43;
    }
LAB_0014b81a:
    ptVar5[-1].twidth = (long)local_a8;
    goto switchD_0014b213_caseD_43;
  case 0x48:
    iVar3 = strncmp(pcVar4,"HEAP",4);
    if ((iVar3 != 0) || (fptr->Fptr->hdutype == 1)) goto switchD_0014b213_caseD_43;
    iVar3 = ffc2jj(value,(LONGLONG *)&local_a8,&local_ac);
    if (iVar3 < 1) {
      fptr->Fptr->heapstart = (LONGLONG)local_a8;
      goto switchD_0014b213_caseD_43;
    }
  }
LAB_0014b454:
  pcVar4 = "Error reading value of %s as an integer: %s";
LAB_0014b734:
  snprintf((char *)local_88,0x51,pcVar4,name,value);
  ffxmsg(5,(char *)local_88);
switchD_0014b213_caseD_43:
  return *status;
}

Assistant:

int ffgtbp(fitsfile *fptr,     /* I - FITS file pointer   */
           char *name,         /* I - name of the keyword */
           char *value,        /* I - value string of the keyword */
           int *status)        /* IO - error status       */
{
/*
  Get TaBle Parameter.  The input keyword name begins with the letter T.
  Test if the keyword is one of the table column definition keywords
  of an ASCII or binary table. If so, decode it and update the value 
  in the structure.
*/
    int tstatus, datacode, decimals;
    long width, repeat, nfield, ivalue;
    LONGLONG jjvalue;
    double dvalue;
    char tvalue[FLEN_VALUE], *loc;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    tstatus = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if(!FSTRNCMP(name + 1, "TYPE", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield ) /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strcpy(colptr->ttype, tvalue);  /* copy col name to structure */
    }
    else if(!FSTRNCMP(name + 1, "FORM", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strncpy(colptr->tform, tvalue, 9);  /* copy TFORM to structure */
        colptr->tform[9] = '\0';            /* make sure it is terminated */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
          if (ffasfm(tvalue, &datacode, &width, &decimals, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = TSTRING; /* store datatype code */
          colptr->trepeat = 1;      /* field repeat count == 1 */
          colptr->twidth = width;   /* the width of the field, in bytes */
        }
        else  /* binary table */
        {
          if (ffbnfm(tvalue, &datacode, &repeat, &width, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = datacode; /* store datatype code */
          colptr->trepeat = (LONGLONG) repeat;     /* field repeat count  */

          /* Don't overwrite the unit string width if it was previously */
	  /* set by a TDIMn keyword and has a legal value */
          if (datacode == TSTRING) {
	    if (colptr->twidth == 0 || colptr->twidth > repeat)
              colptr->twidth = width;   /*  width of a unit string */

          } else {
              colptr->twidth = width;   /*  width of a unit value in chars */
          }
        }
    }
    else if(!FSTRNCMP(name + 1, "BCOL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == BINARY_TBL)
            return(*status);  /* binary tables don't have TBCOL keywords */

        if (ffc2ii(value, &ivalue, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);
            return(*status);
        }
        colptr->tbcol = ivalue - 1; /* convert to zero base */
    }
    else if(!FSTRNCMP(name + 1, "SCAL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tscale = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "ZERO", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tzero = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "NULL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
            if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
                return(*status);

            strncpy(colptr->strnull, tvalue, 17);  /* copy TNULL string */
            colptr->strnull[17] = '\0';  /* terminate the strnull field */

        }
        else  /* binary table */
        {
            if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
            {
                snprintf(message,FLEN_ERRMSG,
                "Error reading value of %s as an integer: %s", name, value);
                ffpmsg(message);

                /* ignore this error, so don't return error status */
                return(*status);
            }
            colptr->tnull = jjvalue; /* null value for integer column */
        }
    }
    else if(!FSTRNCMP(name + 1, "DIM", 3) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't support TDIMn keyword */ 

        /* get the index number */
        if( ffc2ii(name + 4, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;     /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        /* uninitialized columns have tdatatype set = -9999 */
        if (colptr->tdatatype != -9999 && colptr->tdatatype != TSTRING)
	    return(*status);     /* this is not an ASCII string column */
	   
        loc = strchr(value, '(' );  /* find the opening parenthesis */
        if (!loc)
            return(*status);   /* not a proper TDIM keyword */

        loc++;
        width = strtol(loc, &loc, 10);  /* read size of first dimension */
        if (colptr->trepeat != 1 && colptr->trepeat < width)
	    return(*status);  /* string length is greater than column width */

        colptr->twidth = width;   /* set width of a unit string in chars */
    }
    else if (!FSTRNCMP(name + 1, "HEAP", 4) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't have a heap */ 

        if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        (fptr->Fptr)->heapstart = jjvalue; /* starting byte of the heap */
        return(*status);
    }

    return(*status);
}